

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file-server.cpp
# Opt level: O1

TFileInfos * __thiscall
GGSock::FileServer::getFileInfos(TFileInfos *__return_storage_ptr__,FileServer *this)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  pthread_mutex_t *__mutex;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  __mutex = (pthread_mutex_t *)
            &((this->m_impl)._M_t.
              super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
              ._M_t.
              super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
              .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl)->mutex;
  iVar2 = pthread_mutex_lock(__mutex);
  if (iVar2 == 0) {
    std::
    _Rb_tree<int,_std::pair<const_int,_GGSock::FileServer::FileInfo>,_std::_Select1st<std::pair<const_int,_GGSock::FileServer::FileInfo>_>,_std::less<int>,_std::allocator<std::pair<const_int,_GGSock::FileServer::FileInfo>_>_>
    ::operator=(&__return_storage_ptr__->_M_t,
                &(((this->m_impl)._M_t.
                   super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
                   .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl)->
                 fileInfos)._M_t);
    pthread_mutex_unlock(__mutex);
    return __return_storage_ptr__;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

FileServer::TFileInfos FileServer::getFileInfos() const {
    TFileInfos result;

    {
        std::lock_guard<std::mutex> lock(m_impl->mutex);
        result = m_impl->fileInfos;
    }

    return result;
}